

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O0

uint __thiscall antlr::TokenBuffer::mark(TokenBuffer *this)

{
  TokenBuffer *in_RDI;
  
  syncConsume(in_RDI);
  in_RDI->nMarkers = in_RDI->nMarkers + 1;
  return in_RDI->markerOffset;
}

Assistant:

unsigned int TokenBuffer::mark()
{
	syncConsume();
	nMarkers++;
	return markerOffset;
}